

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::wait<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  pthread_mutex_t *__mutex;
  scoped_lock *in_RSI;
  pthread_cond_t *in_RDI;
  
  while ((in_RDI[1].__align & 1U) == 0) {
    in_RDI[1].__align = in_RDI[1].__align + 2;
    __mutex = (pthread_mutex_t *)conditionally_enabled_mutex::scoped_lock::mutex(in_RSI);
    pthread_cond_wait(in_RDI,__mutex);
    in_RDI[1].__align = in_RDI[1].__align + -2;
  }
  return;
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }